

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# istack.c
# Opt level: O0

Bool prvTidyInlineDup1(TidyDocImpl *doc,Node *node,Node *element)

{
  Lexer *pLVar1;
  int local_38;
  int i;
  int n;
  Lexer *lexer;
  Node *element_local;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  pLVar1 = doc->lexer;
  if (((element == (Node *)0x0) || (element->tag == (Dict *)0x0)) ||
     (local_38 = pLVar1->istacksize - pLVar1->istackbase, local_38 < 1)) {
LAB_0016efea:
    doc_local._4_4_ = no;
  }
  else {
    do {
      local_38 = local_38 + -1;
      if (local_38 < 0) goto LAB_0016efea;
    } while (pLVar1->istack[local_38].tag != element->tag);
    pLVar1->insert = pLVar1->istack + local_38;
    pLVar1->inode = node;
    doc_local._4_4_ = yes;
  }
  return doc_local._4_4_;
}

Assistant:

Bool TY_(InlineDup1)( TidyDocImpl* doc, Node* node, Node* element )
{
    Lexer* lexer = doc->lexer;
    int n, i;
    if ( element
         && (element->tag != NULL)
         && ((n = lexer->istacksize - lexer->istackbase) > 0) )
    {
        for ( i = n - 1; i >=0; --i ) {
            if (lexer->istack[i].tag == element->tag) {
                /* found our element tag - insert it */
                lexer->insert = &(lexer->istack[i]);
                lexer->inode = node;
                return yes;
            }
        }
    }
    return no;
}